

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu.c
# Opt level: O0

void host_vendor_fms_x86_64(char *vendor,int *family,int *model,int *stepping)

{
  uint32_t local_38;
  uint32_t local_34;
  uint32_t edx;
  uint32_t ecx;
  uint32_t ebx;
  uint32_t eax;
  int *stepping_local;
  int *model_local;
  int *family_local;
  char *vendor_local;
  
  _ebx = (uint *)stepping;
  stepping_local = model;
  model_local = family;
  family_local = (int *)vendor;
  host_cpuid_x86_64(0,0,&ecx,&edx,&local_34,&local_38);
  host_cpuid_x86_64(1,0,&ecx,&edx,&local_34,&local_38);
  if (model_local != (int *)0x0) {
    *model_local = (ecx >> 8 & 0xf) + (ecx >> 0x14 & 0xff);
  }
  if (stepping_local != (int *)0x0) {
    *stepping_local = ecx >> 4 & 0xf | (ecx & 0xf0000) >> 0xc;
  }
  if (_ebx != (uint *)0x0) {
    *_ebx = ecx & 0xf;
  }
  return;
}

Assistant:

void host_vendor_fms(char *vendor, int *family, int *model, int *stepping)
{
    uint32_t eax, ebx, ecx, edx;

    host_cpuid(0x0, 0, &eax, &ebx, &ecx, &edx);

    host_cpuid(0x1, 0, &eax, &ebx, &ecx, &edx);
    if (family) {
        *family = ((eax >> 8) & 0x0F) + ((eax >> 20) & 0xFF);
    }
    if (model) {
        *model = ((eax >> 4) & 0x0F) | ((eax & 0xF0000) >> 12);
    }
    if (stepping) {
        *stepping = eax & 0x0F;
    }
}